

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_goaway(lws *wsi,uint32_t err,char *reason)

{
  lws_h2_netconn *plVar1;
  lws_h2_protocol_send *pps_00;
  lws_h2_protocol_send *pps;
  lws_h2_netconn *h2n;
  char *reason_local;
  uint32_t err_local;
  lws *wsi_local;
  
  plVar1 = (wsi->h2).h2n;
  if (plVar1->type == '\n') {
    wsi_local._4_4_ = 0;
  }
  else {
    pps_00 = lws_h2_new_pps(LWS_H2_PPS_GOAWAY);
    if (pps_00 == (lws_h2_protocol_send *)0x0) {
      wsi_local._4_4_ = 1;
    }
    else {
      _lws_log(8,"%s: %p: ERR 0x%x, \'%s\'\n","lws_h2_goaway",wsi,(ulong)err,reason);
      (pps_00->u).ga.err = err;
      (pps_00->u).ga.highest_sid = plVar1->highest_sid;
      lws_strncpy((char *)&pps_00->u,reason,0x20);
      lws_pps_schedule(wsi,pps_00);
      plVar1->type = '\n';
      wsi_local._4_4_ = 0;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_h2_goaway(struct lws *wsi, uint32_t err, const char *reason)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (h2n->type == LWS_H2_FRAME_TYPE_COUNT)
		return 0;

	pps = lws_h2_new_pps(LWS_H2_PPS_GOAWAY);
	if (!pps)
		return 1;

	lwsl_info("%s: %p: ERR 0x%x, '%s'\n", __func__, wsi, (int)err, reason);

	pps->u.ga.err = err;
	pps->u.ga.highest_sid = h2n->highest_sid;
	lws_strncpy(pps->u.ga.str, reason, sizeof(pps->u.ga.str));
	lws_pps_schedule(wsi, pps);

	h2n->type = LWS_H2_FRAME_TYPE_COUNT; /* ie, IGNORE */

	return 0;
}